

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::StencilTexturing::FunctionalTest::test
          (FunctionalTest *this,GLenum internal_format,bool is_stencil)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  GLuint dst_texture_id;
  GLuint program_id;
  GLuint src_texture_id;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  exception *exc;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  bool test_result;
  Functions *gl;
  GLuint draw_src_tex_id;
  GLuint draw_program_id;
  GLuint draw_dst_tex_id;
  GLuint compute_src_tex_id;
  GLuint compute_program_id;
  GLuint compute_dst_tex_id;
  bool is_stencil_local;
  GLenum internal_format_local;
  FunctionalTest *this_local;
  long lVar5;
  
  compute_src_tex_id = 0;
  draw_dst_tex_id = 0;
  draw_program_id = 0;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  prepareSourceTextureData
            (this,internal_format,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58)
  ;
  bVar2 = Utils::isExtensionSupported((this->super_TestCase).m_context,"GL_ARB_compute_shader");
  if (bVar2) {
    compute_src_tex_id = prepareDestinationTexture(this,is_stencil);
    draw_dst_tex_id = prepareProgram(this,false,is_stencil);
    draw_program_id =
         prepareSourceTexture
                   (this,internal_format,is_stencil,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    dispatch(this,draw_dst_tex_id,is_stencil,compute_src_tex_id,draw_program_id);
    bVar2 = verifyTexture(this,compute_src_tex_id,internal_format,is_stencil,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    if (!bVar2) {
      texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    }
  }
  dst_texture_id = prepareDestinationTexture(this,is_stencil);
  program_id = prepareProgram(this,true,is_stencil);
  src_texture_id =
       prepareSourceTexture
                 (this,internal_format,is_stencil,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  draw(this,program_id,dst_texture_id,src_texture_id);
  bVar2 = verifyTexture(this,dst_texture_id,internal_format,is_stencil,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  if (!bVar2) {
    texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  }
  (**(code **)(lVar5 + 0xd8))(0);
  (**(code **)(lVar5 + 0x78))(0x8ca9,0);
  (**(code **)(lVar5 + 0x1680))(0);
  Utils::deleteProgram((this->super_TestCase).m_context,draw_dst_tex_id);
  Utils::deleteProgram((this->super_TestCase).m_context,program_id);
  Utils::deleteTexture((this->super_TestCase).m_context,compute_src_tex_id);
  Utils::deleteTexture((this->super_TestCase).m_context,draw_program_id);
  Utils::deleteTexture((this->super_TestCase).m_context,dst_texture_id);
  Utils::deleteTexture((this->super_TestCase).m_context,src_texture_id);
  bVar1 = texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  return (bool)(bVar1 & 1);
}

Assistant:

bool FunctionalTest::test(GLenum internal_format, bool is_stencil)
{
	GLuint				 compute_dst_tex_id = 0;
	GLuint				 compute_program_id = 0;
	GLuint				 compute_src_tex_id = 0;
	GLuint				 draw_dst_tex_id	= 0;
	GLuint				 draw_program_id	= 0;
	GLuint				 draw_src_tex_id	= 0;
	const Functions&	 gl					= m_context.getRenderContext().getFunctions();
	bool				 test_result		= true;
	std::vector<GLubyte> texture_data;

	prepareSourceTextureData(internal_format, texture_data);

	try
	{
		if (true == Utils::isExtensionSupported(m_context, "GL_ARB_compute_shader"))
		{
			compute_dst_tex_id = prepareDestinationTexture(is_stencil);
			compute_program_id = prepareProgram(false, is_stencil);
			compute_src_tex_id = prepareSourceTexture(internal_format, is_stencil, texture_data);

			dispatch(compute_program_id, is_stencil, compute_dst_tex_id, compute_src_tex_id);

			if (false == verifyTexture(compute_dst_tex_id, internal_format, is_stencil, texture_data))
			{
				test_result = false;
			}
		}

		{
			draw_dst_tex_id = prepareDestinationTexture(is_stencil);
			draw_program_id = prepareProgram(true, is_stencil);
			draw_src_tex_id = prepareSourceTexture(internal_format, is_stencil, texture_data);

			draw(draw_program_id, draw_dst_tex_id, draw_src_tex_id);

			if (false == verifyTexture(draw_dst_tex_id, internal_format, is_stencil, texture_data))
			{
				test_result = false;
			}
		}
	}
	catch (std::exception& exc)
	{
		gl.bindVertexArray(0);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
		gl.useProgram(0);

		Utils::deleteProgram(m_context, compute_program_id);
		Utils::deleteProgram(m_context, draw_program_id);

		Utils::deleteTexture(m_context, compute_dst_tex_id);
		Utils::deleteTexture(m_context, compute_src_tex_id);
		Utils::deleteTexture(m_context, draw_dst_tex_id);
		Utils::deleteTexture(m_context, draw_src_tex_id);

		TCU_FAIL(exc.what());
	}

	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.useProgram(0);

	Utils::deleteProgram(m_context, compute_program_id);
	Utils::deleteProgram(m_context, draw_program_id);

	Utils::deleteTexture(m_context, compute_dst_tex_id);
	Utils::deleteTexture(m_context, compute_src_tex_id);
	Utils::deleteTexture(m_context, draw_dst_tex_id);
	Utils::deleteTexture(m_context, draw_src_tex_id);

	/* Done */
	return test_result;
}